

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBar.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBar::ComputeInternalForces(ChElementBar *this,ChVectorDynamic<> *Fi)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVector<double> int_forceB;
  ChVector<double> int_forceA;
  double local_58;
  double dStack_50;
  double local_48;
  double local_38;
  double dStack_30;
  double local_28;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 6) {
    __assert_fail("Fi.size() == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBar.cpp"
                  ,0x5e,
                  "virtual void chrono::fea::ChElementBar::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar6 = *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20 -
          *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
  dVar7 = *(double *)&peVar3->field_0x28 - *(double *)&peVar2->field_0x28;
  dVar14 = *(double *)&peVar3->field_0x30 - *(double *)&peVar2->field_0x30;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar7 * dVar7;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6;
  auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar14;
  auVar15 = vfmadd231sd_fma(auVar15,auVar17,auVar17);
  if (auVar15._0_8_ < 0.0) {
    dVar13 = sqrt(auVar15._0_8_);
  }
  else {
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
    dVar13 = auVar15._0_8_;
  }
  bVar8 = 2.2250738585072014e-308 <= dVar13;
  dVar13 = 1.0 / dVar13;
  dVar12 = (double)((ulong)bVar8 * (long)(dVar6 * dVar13) + (ulong)!bVar8 * 0x3ff0000000000000);
  dVar6 = (double)((ulong)bVar8 * (long)(dVar7 * dVar13));
  dVar7 = (double)((ulong)bVar8 * (long)(dVar14 * dVar13));
  dVar14 = dVar7;
  (*(this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase[0x17])(this);
  local_38 = dVar12 * dVar14;
  dStack_30 = dVar6 * dVar14;
  local_28 = dVar7 * dVar14;
  local_58 = dVar14 * -dVar12;
  dStack_50 = dVar14 * -dVar6;
  local_48 = dVar14 * -dVar7;
  if (2 < (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar4 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar11 = 3;
    if ((((ulong)pdVar4 & 7) == 0) &&
       (uVar9 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7, uVar9 < 3)) {
      uVar11 = uVar9;
    }
    if (uVar11 != 0) {
      memcpy(pdVar4,&local_38,(ulong)(uVar11 * 8));
    }
    if (uVar11 < 3) {
      uVar10 = (ulong)(uVar11 << 3);
      memcpy((void *)((long)pdVar4 + uVar10),(void *)((long)&local_38 + uVar10),0x18 - uVar10);
    }
    if (5 < (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar5 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar4 = pdVar5 + 3;
      uVar11 = 3;
      if ((((ulong)pdVar4 & 7) == 0) &&
         (uVar9 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7, uVar9 < 3)) {
        uVar11 = uVar9;
      }
      if (uVar11 != 0) {
        memcpy(pdVar4,&local_58,(ulong)(uVar11 * 8));
      }
      if (uVar11 < 3) {
        uVar10 = (ulong)(uVar11 << 3);
        memcpy((void *)((long)pdVar5 + uVar10 + 0x18),(void *)((long)&local_58 + uVar10),
               0x18 - uVar10);
      }
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBar::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 6);

	ChVector<> dir = (nodes[1]->GetPos() - nodes[0]->GetPos()).GetNormalized();
	double internal_force_local = GetCurrentForce();
    ChVector<> int_forceA = dir * internal_force_local;
    ChVector<> int_forceB = -dir * internal_force_local;

    Fi.segment(0, 3) = int_forceA.eigen();
    Fi.segment(3, 3) = int_forceB.eigen();
}